

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  TargetType TVar2;
  string f;
  Names targetNames;
  string local_100;
  string dir;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    return;
  }
  this_00 = this->LocalGenerator->GlobalGenerator;
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  targetNames.Base._M_string_length = 0;
  targetNames.Base.field_2._M_local_buf[0] = '\0';
  targetNames.Output._M_dataplus._M_p = (pointer)&targetNames.Output.field_2;
  targetNames.Output._M_string_length = 0;
  targetNames.Output.field_2._M_local_buf[0] = '\0';
  targetNames.Real._M_dataplus._M_p = (pointer)&targetNames.Real.field_2;
  targetNames.Real._M_string_length = 0;
  targetNames.Real.field_2._M_local_buf[0] = '\0';
  targetNames.ImportLibrary._M_dataplus._M_p = (pointer)&targetNames.ImportLibrary.field_2;
  targetNames.ImportLibrary._M_string_length = 0;
  targetNames.ImportLibrary.field_2._M_local_buf[0] = '\0';
  targetNames.PDB._M_dataplus._M_p = (pointer)&targetNames.PDB.field_2;
  targetNames.PDB._M_string_length = 0;
  targetNames.PDB.field_2._M_local_buf[0] = '\0';
  targetNames.SharedObject._M_dataplus._M_p = (pointer)&targetNames.SharedObject.field_2;
  targetNames.SharedObject._M_string_length = 0;
  targetNames.SharedObject.field_2._M_local_buf[0] = '\0';
  TVar2 = GetType(this);
  if (TVar2 == EXECUTABLE) {
    GetExecutableNames((Names *)&dir,this,config);
  }
  else {
    TVar2 = GetType(this);
    if (((TVar2 != STATIC_LIBRARY) && (TVar2 = GetType(this), TVar2 != SHARED_LIBRARY)) &&
       (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) goto LAB_00236888;
    GetLibraryNames((Names *)&dir,this,config);
  }
  Names::operator=(&targetNames,(Names *)&dir);
  Names::~Names((Names *)&dir);
  GetDirectory(&dir,this,config,RuntimeBinaryArtifact);
  f._M_dataplus._M_p = (pointer)&f.field_2;
  f._M_string_length = 0;
  f.field_2._M_local_buf[0] = '\0';
  if (targetNames.Output._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.SharedObject._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.Real._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.PDB._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.ImportLibrary._M_string_length != 0) {
    GetDirectory(&local_100,this,config,ImportLibraryArtifact);
    std::__cxx11::string::operator=((string *)&f,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&dir);
LAB_00236888:
  Names::~Names(&targetNames);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeTargetManifest(const std::string& config) const
{
  if (this->IsImported()) {
    return;
  }
  cmGlobalGenerator* gg = this->LocalGenerator->GetGlobalGenerator();

  // Get the names.
  cmGeneratorTarget::Names targetNames;
  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    targetNames = this->GetExecutableNames(config);
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    targetNames = this->GetLibraryNames(config);
  } else {
    return;
  }

  // Get the directory.
  std::string dir =
    this->GetDirectory(config, cmStateEnums::RuntimeBinaryArtifact);

  // Add each name.
  std::string f;
  if (!targetNames.Output.empty()) {
    f = dir;
    f += "/";
    f += targetNames.Output;
    gg->AddToManifest(f);
  }
  if (!targetNames.SharedObject.empty()) {
    f = dir;
    f += "/";
    f += targetNames.SharedObject;
    gg->AddToManifest(f);
  }
  if (!targetNames.Real.empty()) {
    f = dir;
    f += "/";
    f += targetNames.Real;
    gg->AddToManifest(f);
  }
  if (!targetNames.PDB.empty()) {
    f = dir;
    f += "/";
    f += targetNames.PDB;
    gg->AddToManifest(f);
  }
  if (!targetNames.ImportLibrary.empty()) {
    f = this->GetDirectory(config, cmStateEnums::ImportLibraryArtifact);
    f += "/";
    f += targetNames.ImportLibrary;
    gg->AddToManifest(f);
  }
}